

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O2

BasicBlock * __thiscall
spvtools::opt::IRContext::get_instr_block(IRContext *this,Instruction *instr)

{
  iterator iVar1;
  BasicBlock *pBVar2;
  Instruction *local_10;
  
  local_10 = instr;
  if ((this->valid_analyses_ & kAnalysisInstrToBlockMapping) == kAnalysisNone) {
    BuildInstrToBlockMapping(this);
  }
  iVar1 = std::
          _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->instr_to_block_)._M_h,&local_10);
  if (iVar1.
      super__Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    pBVar2 = (BasicBlock *)0x0;
  }
  else {
    pBVar2 = *(BasicBlock **)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_false>
                     ._M_cur + 0x10);
  }
  return pBVar2;
}

Assistant:

BasicBlock* get_instr_block(Instruction* instr) {
    if (!AreAnalysesValid(kAnalysisInstrToBlockMapping)) {
      BuildInstrToBlockMapping();
    }
    auto entry = instr_to_block_.find(instr);
    return (entry != instr_to_block_.end()) ? entry->second : nullptr;
  }